

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLexer.cpp
# Opt level: O3

void __thiscall Jinx::Impl::Lexer::ParseEndOfLine(Lexer *this)

{
  char *pcVar1;
  pointer pSVar2;
  char cVar3;
  size_t sVar4;
  char *utf8Str;
  
  utf8Str = this->m_current;
  cVar3 = *utf8Str;
  if (cVar3 == '\r') {
    sVar4 = GetUtf8CharSize(utf8Str);
    pcVar1 = this->m_current;
    utf8Str = pcVar1 + sVar4;
    this->m_current = utf8Str;
    this->m_columnNumber = this->m_columnNumber + 1;
    cVar3 = pcVar1[sVar4];
  }
  if ((cVar3 != '\0') && (utf8Str <= this->m_end)) {
    if (cVar3 == '\n') {
      sVar4 = GetUtf8CharSize(utf8Str);
      this->m_current = this->m_current + sVar4;
      this->m_columnNumber = this->m_columnNumber + 1;
    }
    pSVar2 = (this->m_symbolList).
             super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (((this->m_symbolList).
         super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>._M_impl.
         super__Vector_impl_data._M_start != pSVar2) && (pSVar2[-1].type != NewLine)) {
      CreateSymbol(this,NewLine);
    }
    this->m_lineNumber = this->m_lineNumber + 1;
    this->m_columnNumber = 1;
    this->m_columnMarker = 1;
  }
  return;
}

Assistant:

inline_t void Lexer::ParseEndOfLine()
	{
		// Handle both Unix and Windows style line ends.
		if (*m_current == '\r')
			AdvanceCurrent();
		if (IsEndOfText())
			return;
		if (*m_current == '\n')
			AdvanceCurrent();
		// No need to add redundant end of line symbols
		if (!m_symbolList.empty() && m_symbolList.back().type != SymbolType::NewLine)
			CreateSymbol(SymbolType::NewLine);
		++m_lineNumber;
		m_columnNumber = 1;
		m_columnMarker = 1;
	}